

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

Region * __thiscall
remote::Handle::GetRegionByAddress(Region *__return_storage_ptr__,Handle *this,size_t address)

{
  bool bVar1;
  reference pRVar2;
  undefined1 local_e0 [8];
  Region reg;
  iterator __end2;
  iterator __begin2;
  vector<remote::Region,_std::allocator<remote::Region>_> *__range2;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  size_t address_local;
  Handle *this_local;
  Region *r;
  
  Region::Region(__return_storage_ptr__);
  bVar1 = IsValid(this);
  if ((bVar1) && (bVar1 = IsRunning(this), bVar1)) {
    GetRegions((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2,this);
    __end2 = std::vector<remote::Region,_std::allocator<remote::Region>_>::begin
                       ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
    reg.filename.field_2._8_8_ =
         std::vector<remote::Region,_std::allocator<remote::Region>_>::end
                   ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
                                       *)((long)&reg.filename.field_2 + 8)), bVar1) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
               ::operator*(&__end2);
      Region::Region((Region *)local_e0,pRVar2);
      if ((address <= (ulong)local_e0) && (address <= reg.start)) {
        Region::operator=(__return_storage_ptr__,(Region *)local_e0);
      }
      Region::~Region((Region *)local_e0);
      __gnu_cxx::
      __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
      ::operator++(&__end2);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector
              ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
  }
  return __return_storage_ptr__;
}

Assistant:

Region Handle::GetRegionByAddress(size_t address) {
    Region r;

    if(IsValid() && IsRunning()) {
        vector<Region> regions = GetRegions();

        for(auto reg : regions) {
            if(reg.start >= address && address <= reg.end) {
                r = reg;
            }
        }
    }

    return r;
}